

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result btree_next(btree_iterator *it,void *key_buf,void *value_buf)

{
  btree_result bVar1;
  
  bVar1 = _btree_next(it,key_buf,value_buf,(it->btree).height - 1);
  it->flags = it->flags & 0xfc | bVar1 == BTREE_RESULT_SUCCESS;
  return bVar1;
}

Assistant:

btree_result btree_next(struct btree_iterator *it, void *key_buf,
                        void *value_buf)
{
    btree_result br = _btree_next(it, key_buf, value_buf, it->btree.height-1);
    if (br == BTREE_RESULT_SUCCESS) {
        BTREE_ITR_SET_FWD(it);
    } else {
        BTREE_ITR_SET_NONE(it);
    }
    return br;
}